

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t read_part_content(curl_mimepart *part,char *buffer,size_t bufsize,_Bool *hasread)

{
  mime_state *state;
  curl_off_t *pcVar1;
  void *pvVar2;
  curl_mimepart *pcVar3;
  curl_read_callback p_Var4;
  int iVar5;
  size_t sVar6;
  char *trail;
  size_t sVar7;
  
  sVar7 = part->lastreadstatus;
  if (sVar7 + 1 < 2) {
    return sVar7;
  }
  if (sVar7 - 0x10000000 < 2) {
    return sVar7;
  }
  if ((part->datasize == -1) || ((part->state).offset < part->datasize)) {
    if (part->kind != MIMEKIND_FILE) {
      if (part->kind == MIMEKIND_MULTIPART) {
        pvVar2 = part->arg;
        state = (mime_state *)((long)pvVar2 + 0x50);
        sVar7 = 0;
        for (; bufsize != 0; bufsize = bufsize - sVar6) {
          sVar6 = 0;
          if (state->state < MIMESTATE_LAST) {
            pcVar3 = *(curl_mimepart **)((long)pvVar2 + 0x58);
            switch(state->state) {
            case MIMESTATE_BEGIN:
            case MIMESTATE_BODY:
              *(undefined4 *)((long)pvVar2 + 0x50) = 5;
              *(undefined8 *)((long)pvVar2 + 0x58) = *(undefined8 *)((long)pvVar2 + 0x10);
              *(undefined8 *)((long)pvVar2 + 0x60) = 2;
LAB_00492d2e:
              sVar6 = 0;
              break;
            case MIMESTATE_BOUNDARY1:
              sVar6 = readback_bytes(state,buffer,bufsize,"\r\n--",4,"",0);
              if (sVar6 == 0) {
                *(undefined4 *)((long)pvVar2 + 0x50) = 6;
                *(curl_mimepart **)((long)pvVar2 + 0x58) = pcVar3;
LAB_00492e5a:
                *(undefined8 *)((long)pvVar2 + 0x60) = 0;
                sVar6 = 0;
              }
              break;
            case MIMESTATE_BOUNDARY2:
              if (pcVar3 == (curl_mimepart *)0x0) {
                sVar6 = 4;
                trail = "--\r\n";
              }
              else {
                sVar6 = 2;
                trail = "\r\n";
              }
              sVar6 = readback_bytes(state,buffer,bufsize,(char *)((long)pvVar2 + 0x20),0x28,trail,
                                     sVar6);
              if (sVar6 == 0) {
                *(undefined4 *)((long)pvVar2 + 0x50) = 7;
                *(curl_mimepart **)((long)pvVar2 + 0x58) = pcVar3;
                *(undefined8 *)((long)pvVar2 + 0x60) = 0;
                goto LAB_00492d2e;
              }
              break;
            case MIMESTATE_CONTENT:
              if (pcVar3 == (curl_mimepart *)0x0) {
                state->state = MIMESTATE_END;
                *(undefined8 *)((long)pvVar2 + 0x58) = 0;
                *(undefined8 *)((long)pvVar2 + 0x60) = 0;
                goto LAB_00492d2e;
              }
              sVar6 = readback_part(pcVar3,buffer,bufsize,hasread);
              if (sVar6 == 0) {
                pcVar3 = pcVar3->nextpart;
                *(undefined4 *)((long)pvVar2 + 0x50) = 5;
                *(curl_mimepart **)((long)pvVar2 + 0x58) = pcVar3;
                goto LAB_00492e5a;
              }
              if ((sVar6 - 0x10000000 < 2) || (sVar6 + 2 < 2)) {
                if (sVar7 == 0) {
                  sVar7 = sVar6;
                }
                goto switchD_00492d15_caseD_8;
              }
              break;
            case MIMESTATE_END:
              goto switchD_00492d15_caseD_8;
            }
          }
          sVar7 = sVar7 + sVar6;
          buffer = buffer + sVar6;
        }
      }
      else {
LAB_00492e92:
        p_Var4 = part->readfunc;
        if (p_Var4 == (curl_read_callback)0x0) goto LAB_00492eae;
        if ((part->flags & 4) == 0) {
          if (*hasread != false) {
            return 0xfffffffffffffffe;
          }
          *hasread = true;
        }
        sVar7 = (*p_Var4)(buffer,1,bufsize,part->arg);
      }
switchD_00492d15_caseD_8:
      if ((1 < sVar7 + 1) && (1 < sVar7 - 0x10000000)) {
        if (sVar7 == 0xfffffffffffffffe) {
          return 0xfffffffffffffffe;
        }
        pcVar1 = &(part->state).offset;
        *pcVar1 = *pcVar1 + sVar7;
      }
      goto LAB_00492eb1;
    }
    if (((FILE *)part->fp == (FILE *)0x0) || (iVar5 = feof((FILE *)part->fp), iVar5 == 0))
    goto LAB_00492e92;
  }
LAB_00492eae:
  sVar7 = 0;
LAB_00492eb1:
  part->lastreadstatus = sVar7;
  return sVar7;
}

Assistant:

static size_t read_part_content(curl_mimepart *part,
                                char *buffer, size_t bufsize, bool *hasread)
{
  size_t sz = 0;

  switch(part->lastreadstatus) {
  case 0:
  case CURL_READFUNC_ABORT:
  case CURL_READFUNC_PAUSE:
  case READ_ERROR:
    return part->lastreadstatus;
  default:
    break;
  }

  /* If we can determine we are at end of part data, spare a read. */
  if(part->datasize != (curl_off_t) -1 &&
     part->state.offset >= part->datasize) {
    /* sz is already zero. */
  }
  else {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      /*
       * Cannot be processed as other kinds since read function requires
       * an additional parameter and is highly recursive.
       */
       sz = mime_subparts_read(buffer, 1, bufsize, part->arg, hasread);
       break;
    case MIMEKIND_FILE:
      if(part->fp && feof(part->fp))
        break;  /* At EOF. */
      /* FALLTHROUGH */
    default:
      if(part->readfunc) {
        if(!(part->flags & MIME_FAST_READ)) {
          if(*hasread)
            return STOP_FILLING;
          *hasread = TRUE;
        }
        sz = part->readfunc(buffer, 1, bufsize, part->arg);
      }
      break;
    }
  }

  switch(sz) {
  case STOP_FILLING:
    break;
  case 0:
  case CURL_READFUNC_ABORT:
  case CURL_READFUNC_PAUSE:
  case READ_ERROR:
    part->lastreadstatus = sz;
    break;
  default:
    part->state.offset += sz;
    part->lastreadstatus = sz;
    break;
  }

  return sz;
}